

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeDrawList(ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  bool bVar1;
  uint uVar2;
  ImDrawVert *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  ImDrawCmd *pIVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  uint uVar14;
  ImDrawCmd *draw_cmd;
  ulong uVar15;
  ImGuiWindow *pIVar16;
  uint uVar17;
  char *pcVar18;
  unsigned_short *puVar19;
  int iVar20;
  long lVar21;
  float fVar22;
  ImGuiListClipper clipper;
  ImVec2 local_190;
  ImVec2 triangle_1 [3];
  char buf [300];
  undefined1 local_3c [12];
  
  pIVar4 = GImGui;
  iVar20 = (draw_list->CmdBuffer).Size;
  lVar21 = (long)iVar20;
  if ((0 < lVar21) && (pIVar10 = (draw_list->CmdBuffer).Data, pIVar10[lVar21 + -1].ElemCount == 0))
  {
    iVar20 = iVar20 - (uint)(pIVar10[lVar21 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  pcVar18 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar18 = draw_list->_OwnerName;
  }
  bVar6 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar18,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar20);
  pIVar5 = GImGui;
  pIVar16 = GImGui->CurrentWindow;
  pIVar16->WriteAccessed = true;
  if (pIVar16->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x33;
    buf[5] = -0x34;
    buf[6] = -0x34;
    buf[7] = '>';
    buf[8] = -0x33;
    buf[9] = -0x34;
    buf[10] = -0x34;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (!bVar6) {
      return;
    }
  }
  else {
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar6) {
        return;
      }
    }
    else {
      bVar7 = IsItemHovered(0);
      if (bVar7) {
        buf._4_4_ = (window->Size).y + (window->Pos).y;
        buf._0_4_ = (window->Size).x + (window->Pos).x;
        ImDrawList::AddRect(&pIVar5->ForegroundDrawList,&window->Pos,(ImVec2 *)buf,0xff00ffff,0.0,
                            0xf,1.0);
      }
      if (!bVar6) {
        return;
      }
      if (window->WasActive == false) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
    }
    pIVar10 = (draw_list->CmdBuffer).Data;
    for (draw_cmd = pIVar10; draw_cmd < pIVar10 + iVar20; draw_cmd = draw_cmd + 1) {
      if (draw_cmd->UserCallback == (ImDrawCallback)0x0) {
        ImFormatString(buf,300,"DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                       SUB84((double)(draw_cmd->ClipRect).x,0),
                       SUB84((double)(draw_cmd->ClipRect).y,0),(double)(draw_cmd->ClipRect).z,
                       (double)(draw_cmd->ClipRect).w,(ulong)draw_cmd->ElemCount / 3,
                       draw_cmd->TextureId);
        bVar6 = TreeNode((void *)(((long)draw_cmd - (long)(draw_list->CmdBuffer).Data) / 0x38),"%s",
                         buf);
        pIVar16 = (ImGuiWindow *)0x0;
        bVar7 = IsItemHovered(0);
        if (bVar7) {
          bVar7 = (pIVar4->DebugMetricsConfig).ShowDrawCmdMesh;
          bVar1 = (pIVar4->DebugMetricsConfig).ShowDrawCmdBoundingBoxes;
          if (((bVar7 | bVar1) & 1U) != 0) {
            DebugNodeDrawCmdShowMeshAndBoundingBox
                      (pIVar16,draw_list,draw_cmd,bVar7,(bool)((~bVar7 | bVar1) & 1));
          }
        }
        if (bVar6) {
          if ((draw_list->IdxBuffer).Size < 1) {
            puVar19 = (unsigned_short *)0x0;
          }
          else {
            puVar19 = (draw_list->IdxBuffer).Data;
          }
          uVar2 = draw_cmd->VtxOffset;
          uVar14 = draw_cmd->IdxOffset;
          pIVar3 = (draw_list->VtxBuffer).Data;
          uVar8 = draw_cmd->ElemCount + uVar14;
          fVar22 = 0.0;
          for (; uVar14 < uVar8; uVar14 = uVar14 + 3) {
            clipper.ItemsHeight = 0.0;
            clipper.StartPosY = 0.0;
            clipper.DisplayStart = 0;
            clipper.DisplayEnd = 0;
            clipper.ItemsCount = 0;
            clipper.StepNo = 0;
            for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
              uVar17 = (uint)((ulong)uVar14 + lVar21);
              if (puVar19 != (unsigned_short *)0x0) {
                uVar17 = (uint)puVar19[(ulong)uVar14 + lVar21 & 0xffffffff];
              }
              *(ImVec2 *)(&clipper.DisplayStart + lVar21 * 2) =
                   pIVar3[(ulong)uVar2 + (ulong)uVar17].pos;
            }
            fVar22 = fVar22 + ABS(((float)clipper.DisplayEnd - (float)clipper.StepNo) *
                                  clipper.ItemsHeight +
                                  ((float)clipper.StepNo - clipper.StartPosY) *
                                  (float)clipper.DisplayStart +
                                  (clipper.StartPosY - (float)clipper.DisplayEnd) *
                                  (float)clipper.ItemsCount) * 0.5;
          }
          ImFormatString(buf,300,
                         "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                         SUB84((double)fVar22,0));
          clipper.DisplayStart = 0;
          clipper.DisplayEnd = 0;
          Selectable(buf,false,0,(ImVec2 *)&clipper);
          pIVar16 = (ImGuiWindow *)0x0;
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            DebugNodeDrawCmdShowMeshAndBoundingBox(pIVar16,draw_list,draw_cmd,true,false);
          }
          ImGuiListClipper::ImGuiListClipper(&clipper);
          clipper.ItemsCount = draw_cmd->ElemCount / 3;
          clipper.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
          clipper.StepNo = 0;
          clipper.ItemsHeight = -1.0;
          clipper.DisplayStart = -1;
          clipper.DisplayEnd = 0;
          while (bVar6 = ImGuiListClipper::Step(&clipper), bVar6) {
            uVar15 = (ulong)(clipper.DisplayStart * 3 + draw_cmd->IdxOffset);
            for (iVar12 = clipper.DisplayStart; iVar12 < clipper.DisplayEnd; iVar12 = iVar12 + 1) {
              triangle_1[0].x = 0.0;
              triangle_1[0].y = 0.0;
              triangle_1[1].x = 0.0;
              triangle_1[1].y = 0.0;
              triangle_1[2].x = 0.0;
              triangle_1[2].y = 0.0;
              pcVar18 = buf;
              for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
                if (puVar19 == (unsigned_short *)0x0) {
                  uVar14 = (int)uVar15 + (int)lVar21;
                }
                else {
                  uVar14 = (uint)puVar19[(int)uVar15 + lVar21];
                }
                lVar11 = (long)(int)uVar14;
                triangle_1[lVar21] = pIVar3[(ulong)uVar2 + lVar11].pos;
                pcVar13 = "     ";
                if (lVar21 == 0) {
                  pcVar13 = "Vert:";
                }
                iVar9 = ImFormatString(pcVar18,(size_t)(local_3c + -(long)pcVar18),
                                       "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                       SUB84((double)pIVar3[(ulong)uVar2 + lVar11].pos.x,0),
                                       SUB84((double)pIVar3[(ulong)uVar2 + lVar11].pos.y,0),
                                       (double)pIVar3[(ulong)uVar2 + lVar11].uv.x,
                                       (double)pIVar3[(ulong)uVar2 + lVar11].uv.y,pcVar13,
                                       (uVar15 & 0xffffffff) + lVar21,
                                       (ulong)pIVar3[(ulong)uVar2 + lVar11].col);
                pcVar18 = pcVar18 + iVar9;
              }
              local_190.x = 0.0;
              local_190.y = 0.0;
              Selectable(buf,false,0,&local_190);
              bVar6 = IsItemHovered(0);
              if (bVar6) {
                uVar14 = (pIVar5->ForegroundDrawList).Flags;
                (pIVar5->ForegroundDrawList).Flags = uVar14 & 0xfffffffe;
                ImDrawList::AddPolyline
                          (&pIVar5->ForegroundDrawList,triangle_1,3,0xff00ffff,true,1.0);
                (pIVar5->ForegroundDrawList).Flags = uVar14;
              }
              uVar15 = (uVar15 & 0xffffffff) + 3;
            }
          }
          TreePop();
          ImGuiListClipper::~ImGuiListClipper(&clipper);
        }
      }
      else {
        BulletText("Callback %p, user_data %p",draw_cmd->UserCallback,draw_cmd->UserCallbackData);
      }
      pIVar10 = (draw_list->CmdBuffer).Data;
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}